

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O2

void __thiscall Model::Simulate(Model *this,int time_limit,double time_step,string *output)

{
  double time_stamp;
  SpeciesTracker *this_00;
  ostream *poVar1;
  double local_268;
  string local_250;
  ofstream countfile;
  
  this_00 = SpeciesTracker::Instance();
  Initialize(this);
  std::ofstream::ofstream((ostream *)&countfile,(string *)output,_S_trunc);
  std::operator<<((ostream *)&countfile,"time\tspecies\tprotein\ttranscript\tribo_density\n");
  local_268 = 0.0;
  while (time_stamp = (this->gillespie_).time_, time_stamp < (double)time_limit) {
    if (local_268 - time_stamp < 0.001) {
      SpeciesTracker::GatherCounts_abi_cxx11_(&local_250,this_00,time_stamp);
      std::operator<<((ostream *)&countfile,(string *)&local_250);
      std::__cxx11::string::~string((string *)&local_250);
      std::ostream::flush();
      local_268 = local_268 + time_step;
    }
    Gillespie::Iterate(&this->gillespie_);
  }
  std::ofstream::close();
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Simulation successful. Ignore any warnings that follow.");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::ofstream::~ofstream(&countfile);
  return;
}

Assistant:

void Model::Simulate(int time_limit, double time_step,
                     const std::string &output = "counts.tsv") {
  auto &tracker = SpeciesTracker::Instance();
  Initialize();
  // Set up file output streams
  std::ofstream countfile(output, std::ios::trunc);
  // Output header
  countfile << "time\tspecies\tprotein\ttranscript\tribo_density\n";
  double out_time = 0.0;
  while (gillespie_.time() < time_limit) {
    if ((out_time - gillespie_.time()) < 0.001) {
      countfile << tracker.GatherCounts(gillespie_.time());
      countfile.flush();
      out_time += time_step;
    }
    gillespie_.Iterate();
  }
  countfile.close();
  std::cout << "Simulation successful. Ignore any warnings that follow." << std::endl;
}